

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkparse.c
# Opt level: O0

int pk_group_from_specified(mbedtls_asn1_buf *params,mbedtls_ecp_group *grp)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int local_54;
  size_t sStack_50;
  int ver;
  size_t len;
  uchar *end_curve;
  uchar *end_field;
  uchar *end;
  uchar *p;
  mbedtls_ecp_group *pmStack_20;
  int ret;
  mbedtls_ecp_group *grp_local;
  mbedtls_asn1_buf *params_local;
  
  end = params->p;
  end_field = params->p + params->len;
  pmStack_20 = grp;
  grp_local = (mbedtls_ecp_group *)params;
  p._4_4_ = mbedtls_asn1_get_int(&end,end_field,&local_54);
  if (p._4_4_ == 0) {
    if ((local_54 < 1) || (3 < local_54)) {
      params_local._4_4_ = -0x3d00;
    }
    else {
      p._4_4_ = mbedtls_asn1_get_tag(&end,end_field,&stack0xffffffffffffffb0,0x30);
      params_local._4_4_ = p._4_4_;
      if (p._4_4_ == 0) {
        end_curve = end + sStack_50;
        p._4_4_ = mbedtls_asn1_get_tag(&end,end_curve,&stack0xffffffffffffffb0,6);
        params_local._4_4_ = p._4_4_;
        if (p._4_4_ == 0) {
          if ((sStack_50 == 7) && (iVar1 = memcmp(end,anon_var_dwarf_8915b,7), iVar1 == 0)) {
            end = end + sStack_50;
            p._4_4_ = mbedtls_asn1_get_mpi(&end,end_curve,&pmStack_20->P);
            if (p._4_4_ == 0) {
              sVar2 = mbedtls_mpi_bitlen(&pmStack_20->P);
              pmStack_20->pbits = sVar2;
              if (end == end_curve) {
                p._4_4_ = mbedtls_asn1_get_tag(&end,end_field,&stack0xffffffffffffffb0,0x30);
                params_local._4_4_ = p._4_4_;
                if (p._4_4_ == 0) {
                  len = (size_t)(end + sStack_50);
                  p._4_4_ = mbedtls_asn1_get_tag(&end,(uchar *)len,&stack0xffffffffffffffb0,4);
                  if ((p._4_4_ == 0) &&
                     (p._4_4_ = mbedtls_mpi_read_binary(&pmStack_20->A,end,sStack_50), p._4_4_ == 0)
                     ) {
                    end = end + sStack_50;
                    p._4_4_ = mbedtls_asn1_get_tag(&end,(uchar *)len,&stack0xffffffffffffffb0,4);
                    if ((p._4_4_ == 0) &&
                       (p._4_4_ = mbedtls_mpi_read_binary(&pmStack_20->B,end,sStack_50),
                       p._4_4_ == 0)) {
                      end = end + sStack_50;
                      p._4_4_ = mbedtls_asn1_get_tag(&end,(uchar *)len,&stack0xffffffffffffffb0,3);
                      if (p._4_4_ == 0) {
                        end = end + sStack_50;
                      }
                      if (end == (uchar *)len) {
                        p._4_4_ = mbedtls_asn1_get_tag(&end,end_field,&stack0xffffffffffffffb0,4);
                        if (p._4_4_ == 0) {
                          p._4_4_ = mbedtls_ecp_point_read_binary
                                              (pmStack_20,&pmStack_20->G,end,sStack_50);
                          sVar2 = sStack_50;
                          if ((p._4_4_ == 0) ||
                             (((p._4_4_ == -0x4e80 &&
                               (((*end == '\x02' || (*end == '\x03')) &&
                                (sVar3 = mbedtls_mpi_size(&pmStack_20->P), sVar2 == sVar3 + 1)))) &&
                              (((iVar1 = mbedtls_mpi_read_binary
                                                   (&(pmStack_20->G).X,end + 1,sStack_50 - 1),
                                iVar1 == 0 &&
                                (iVar1 = mbedtls_mpi_lset(&(pmStack_20->G).Y,(long)(int)(*end - 2)),
                                iVar1 == 0)) &&
                               (iVar1 = mbedtls_mpi_lset(&(pmStack_20->G).Z,1), iVar1 == 0)))))) {
                            end = end + sStack_50;
                            p._4_4_ = mbedtls_asn1_get_mpi(&end,end_field,&pmStack_20->N);
                            if (p._4_4_ == 0) {
                              sVar2 = mbedtls_mpi_bitlen(&pmStack_20->N);
                              pmStack_20->nbits = sVar2;
                              params_local._4_4_ = 0;
                            }
                            else {
                              params_local._4_4_ = p._4_4_ + -0x3d00;
                            }
                          }
                          else {
                            params_local._4_4_ = -0x3d00;
                          }
                        }
                        else {
                          params_local._4_4_ = p._4_4_ + -0x3d00;
                        }
                      }
                      else {
                        params_local._4_4_ = -0x3d66;
                      }
                    }
                    else {
                      params_local._4_4_ = p._4_4_ + -0x3d00;
                    }
                  }
                  else {
                    params_local._4_4_ = p._4_4_ + -0x3d00;
                  }
                }
              }
              else {
                params_local._4_4_ = -0x3d66;
              }
            }
            else {
              params_local._4_4_ = p._4_4_ + -0x3d00;
            }
          }
          else {
            params_local._4_4_ = -0x3980;
          }
        }
      }
    }
  }
  else {
    params_local._4_4_ = p._4_4_ + -0x3d00;
  }
  return params_local._4_4_;
}

Assistant:

static int pk_group_from_specified( const mbedtls_asn1_buf *params, mbedtls_ecp_group *grp )
{
    int ret;
    unsigned char *p = params->p;
    const unsigned char * const end = params->p + params->len;
    const unsigned char *end_field, *end_curve;
    size_t len;
    int ver;

    /* SpecifiedECDomainVersion ::= INTEGER { 1, 2, 3 } */
    if( ( ret = mbedtls_asn1_get_int( &p, end, &ver ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ver < 1 || ver > 3 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );

    /*
     * FieldID { FIELD-ID:IOSet } ::= SEQUENCE { -- Finite field
     *       fieldType FIELD-ID.&id({IOSet}),
     *       parameters FIELD-ID.&Type({IOSet}{@fieldType})
     * }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    end_field = p + len;

    /*
     * FIELD-ID ::= TYPE-IDENTIFIER
     * FieldTypes FIELD-ID ::= {
     *       { Prime-p IDENTIFIED BY prime-field } |
     *       { Characteristic-two IDENTIFIED BY characteristic-two-field }
     * }
     * prime-field OBJECT IDENTIFIER ::= { id-fieldType 1 }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end_field, &len, MBEDTLS_ASN1_OID ) ) != 0 )
        return( ret );

    if( len != MBEDTLS_OID_SIZE( MBEDTLS_OID_ANSI_X9_62_PRIME_FIELD ) ||
        memcmp( p, MBEDTLS_OID_ANSI_X9_62_PRIME_FIELD, len ) != 0 )
    {
        return( MBEDTLS_ERR_PK_FEATURE_UNAVAILABLE );
    }

    p += len;

    /* Prime-p ::= INTEGER -- Field of size p. */
    if( ( ret = mbedtls_asn1_get_mpi( &p, end_field, &grp->P ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    grp->pbits = mbedtls_mpi_bitlen( &grp->P );

    if( p != end_field )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    /*
     * Curve ::= SEQUENCE {
     *       a FieldElement,
     *       b FieldElement,
     *       seed BIT STRING OPTIONAL
     *       -- Shall be present if used in SpecifiedECDomain
     *       -- with version equal to ecdpVer2 or ecdpVer3
     * }
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len,
            MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE ) ) != 0 )
        return( ret );

    end_curve = p + len;

    /*
     * FieldElement ::= OCTET STRING
     * containing an integer in the case of a prime field
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end_curve, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 ||
        ( ret = mbedtls_mpi_read_binary( &grp->A, p, len ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    p += len;

    if( ( ret = mbedtls_asn1_get_tag( &p, end_curve, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 ||
        ( ret = mbedtls_mpi_read_binary( &grp->B, p, len ) ) != 0 )
    {
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );
    }

    p += len;

    /* Ignore seed BIT STRING OPTIONAL */
    if( ( ret = mbedtls_asn1_get_tag( &p, end_curve, &len, MBEDTLS_ASN1_BIT_STRING ) ) == 0 )
        p += len;

    if( p != end_curve )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT +
                MBEDTLS_ERR_ASN1_LENGTH_MISMATCH );

    /*
     * ECPoint ::= OCTET STRING
     */
    if( ( ret = mbedtls_asn1_get_tag( &p, end, &len, MBEDTLS_ASN1_OCTET_STRING ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    if( ( ret = mbedtls_ecp_point_read_binary( grp, &grp->G,
                                      ( const unsigned char *) p, len ) ) != 0 )
    {
        /*
         * If we can't read the point because it's compressed, cheat by
         * reading only the X coordinate and the parity bit of Y.
         */
        if( ret != MBEDTLS_ERR_ECP_FEATURE_UNAVAILABLE ||
            ( p[0] != 0x02 && p[0] != 0x03 ) ||
            len != mbedtls_mpi_size( &grp->P ) + 1 ||
            mbedtls_mpi_read_binary( &grp->G.X, p + 1, len - 1 ) != 0 ||
            mbedtls_mpi_lset( &grp->G.Y, p[0] - 2 ) != 0 ||
            mbedtls_mpi_lset( &grp->G.Z, 1 ) != 0 )
        {
            return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT );
        }
    }

    p += len;

    /*
     * order INTEGER
     */
    if( ( ret = mbedtls_asn1_get_mpi( &p, end, &grp->N ) ) != 0 )
        return( MBEDTLS_ERR_PK_KEY_INVALID_FORMAT + ret );

    grp->nbits = mbedtls_mpi_bitlen( &grp->N );

    /*
     * Allow optional elements by purposefully not enforcing p == end here.
     */

    return( 0 );
}